

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
node::anon_unknown_2::ChainImpl::handleRpc(ChainImpl *this,CRPCCommand *command)

{
  long lVar1;
  CRPCCommand *in_RSI;
  _Head_base<0UL,_interfaces::Handler_*,_false> in_RDI;
  long in_FS_OFFSET;
  _Head_base<0UL,_interfaces::Handler_*,_false> this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl = in_RDI._M_head_impl;
  std::make_unique<node::(anonymous_namespace)::RpcHandlerImpl,CRPCCommand_const&>(in_RSI);
  std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>::
  unique_ptr<node::(anonymous_namespace)::RpcHandlerImpl,std::default_delete<node::(anonymous_namespace)::RpcHandlerImpl>,void>
            ((unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)
             this_00._M_head_impl,
             (unique_ptr<node::(anonymous_namespace)::RpcHandlerImpl,_std::default_delete<node::(anonymous_namespace)::RpcHandlerImpl>_>
              *)in_RDI._M_head_impl);
  std::
  unique_ptr<node::(anonymous_namespace)::RpcHandlerImpl,_std::default_delete<node::(anonymous_namespace)::RpcHandlerImpl>_>
  ::~unique_ptr((unique_ptr<node::(anonymous_namespace)::RpcHandlerImpl,_std::default_delete<node::(anonymous_namespace)::RpcHandlerImpl>_>
                 *)this_00._M_head_impl);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>)
             in_RDI._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleRpc(const CRPCCommand& command) override
    {
        return std::make_unique<RpcHandlerImpl>(command);
    }